

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.h
# Opt level: O3

ostream * operator<<(ostream *out,Company *cp)

{
  Employee **ppEVar1;
  Employee *pEVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  ostream *os;
  int iVar5;
  uint uVar6;
  int iVar7;
  Company *this;
  ulong uVar8;
  ostream *poVar9;
  long *plVar10;
  long *__n;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong unaff_RBP;
  long *unaff_R12;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  string local_c8;
  ulong local_a8;
  Company *local_a0;
  string local_98;
  ostream *local_78;
  string local_70;
  long *local_50;
  long *local_48;
  long local_40 [2];
  
  local_78 = out;
  this = (Company *)operator_new(0x18);
  Company::Company(this,cp);
  uVar8 = 0;
  uVar15 = 0;
  local_a0 = this;
LAB_001056ad:
  do {
    local_a8 = CONCAT44(local_a8._4_4_,(int)uVar8);
    uVar15 = uVar15 & 0xffffffff;
    do {
      uVar8 = uVar15;
      iVar5 = Boss::getNumberOfEmployees(this->boss);
      iVar5 = iVar5 + -1;
      iVar13 = (int)uVar8;
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),iVar13 < iVar5);
      if (iVar5 <= iVar13) {
        uVar15 = 0;
        uVar8 = unaff_RBP & 0xffffffff;
        if ((local_a8 & 1) != 0) goto LAB_001056ad;
        uVar8 = 0;
        uVar15 = 0;
        goto LAB_001057cd;
      }
      Person::getName_abi_cxx11_(&local_c8,&this->employees[uVar8]->super_Person);
      uVar15 = uVar8 + 1;
      uVar14 = uVar15 & 0xffffffff;
      Person::getName_abi_cxx11_(&local_98,&this->employees[uVar14]->super_Person);
      unaff_R12 = (long *)local_98._M_string_length;
      _Var4._M_p = local_98._M_dataplus._M_p;
      sVar3 = local_c8._M_string_length;
      plVar10 = (long *)local_c8._M_string_length;
      if (local_98._M_string_length < local_c8._M_string_length) {
        plVar10 = (long *)local_98._M_string_length;
      }
      if (plVar10 == (long *)0x0) {
LAB_0010572c:
        uVar11 = sVar3 - (long)unaff_R12;
        if ((long)uVar11 < -0x7fffffff) {
          uVar11 = 0xffffffff80000000;
        }
        if (0x7ffffffe < (long)uVar11) {
          uVar11 = 0x7fffffff;
        }
        unaff_RBP = uVar11 & 0xffffffff;
      }
      else {
        uVar6 = memcmp(local_c8._M_dataplus._M_p,local_98._M_dataplus._M_p,(size_t)plVar10);
        unaff_RBP = (ulong)uVar6;
        if (uVar6 == 0) goto LAB_0010572c;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != &local_98.field_2) {
        operator_delete(_Var4._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      this = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    } while ((int)unaff_RBP < 1);
    ppEVar1 = this->employees;
    pEVar2 = ppEVar1[uVar8];
    ppEVar1[uVar8] = ppEVar1[uVar14];
    ppEVar1[uVar14] = pEVar2;
    uVar8 = CONCAT71((int7)((ulong)ppEVar1 >> 8),iVar13 < iVar5);
  } while( true );
LAB_001057cd:
  uVar15 = uVar15 & 0xffffffff;
  local_a8 = uVar8;
  do {
    uVar8 = uVar15;
    iVar5 = Boss::getNumberOfEmployees(this->boss);
    os = local_78;
    iVar5 = iVar5 + -1;
    iVar13 = (int)uVar8;
    unaff_R12 = (long *)CONCAT71((int7)((ulong)unaff_R12 >> 8),iVar13 < iVar5);
    if (iVar5 <= iVar13) {
      uVar15 = 0;
      uVar8 = (ulong)unaff_R12 & 0xffffffff;
      if ((local_a8 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_78,"Boss : ",7);
        poVar9 = operator<<(os,this->boss);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        plVar10 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        iVar5 = Boss::getNumberOfEmployees(this->boss);
        if (0 < iVar5) {
          lVar12 = 0;
          do {
            poVar9 = operator<<(os,this->employees[lVar12]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            dVar16 = Employee::efficiency(this->employees[lVar12]);
            poVar9 = std::ostream::_M_insert<double>(dVar16);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            plVar10 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
            std::ostream::put((char)plVar10);
            std::ostream::flush();
            lVar12 = lVar12 + 1;
            iVar5 = Boss::getNumberOfEmployees(this->boss);
          } while (lVar12 < iVar5);
        }
        return os;
      }
      goto LAB_001057cd;
    }
    Person::getId_abi_cxx11_(&local_98,&this->employees[uVar8]->super_Person);
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_98);
    uVar15 = uVar8 + 1;
    uVar14 = uVar15 & 0xffffffff;
    Person::getId_abi_cxx11_(&local_70,&this->employees[uVar14]->super_Person);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    plVar10 = local_48;
    unaff_R12 = local_50;
    sVar3 = local_c8._M_string_length;
    __n = (long *)local_c8._M_string_length;
    if (local_48 < local_c8._M_string_length) {
      __n = local_48;
    }
    if (__n == (long *)0x0) {
LAB_0010587e:
      lVar12 = sVar3 - (long)plVar10;
      if (lVar12 < -0x7fffffff) {
        lVar12 = -0x80000000;
      }
      if (0x7ffffffe < lVar12) {
        lVar12 = 0x7fffffff;
      }
      iVar7 = (int)lVar12;
    }
    else {
      iVar7 = memcmp(local_c8._M_dataplus._M_p,local_50,(size_t)__n);
      if (iVar7 == 0) goto LAB_0010587e;
    }
    if (unaff_R12 != local_40) {
      operator_delete(unaff_R12,local_40[0] + 1);
    }
    this = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  } while (-1 < iVar7);
  ppEVar1 = this->employees;
  pEVar2 = ppEVar1[uVar8];
  ppEVar1[uVar8] = ppEVar1[uVar14];
  ppEVar1[uVar14] = pEVar2;
  uVar8 = CONCAT71((int7)((ulong)ppEVar1 >> 8),iVar13 < iVar5);
  goto LAB_001057cd;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Company &cp) {
          auto *temp = new Company(cp);
        bool flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getName() > temp->employees[i + 1]->getName()) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }
        flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getId().substr(0, 2) < temp->employees[i + 1]->getId().substr(0, 2)) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }


        out << "Boss : "<<*(temp->boss) << std::endl << std::endl;
        for (int i = 0; i < temp->boss->getNumberOfEmployees(); ++i) {
            out << *(temp->employees[i]) << std::endl << temp->employees[i]->efficiency() << std::endl << std::endl;

        }
        return out;
    }